

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

uintptr_t ngx_escape_json(u_char *dst,u_char *src,size_t size)

{
  byte bVar1;
  u_char uVar2;
  u_char *puVar3;
  u_char *local_38;
  ngx_uint_t len;
  size_t sStack_28;
  u_char ch;
  size_t size_local;
  u_char *src_local;
  u_char *dst_local;
  
  sStack_28 = size;
  size_local = (size_t)src;
  src_local = dst;
  if (dst == (u_char *)0x0) {
    local_38 = (u_char *)0x0;
    size_local = (size_t)src;
    for (; sStack_28 != 0; sStack_28 = sStack_28 - 1) {
      bVar1 = *(byte *)size_local;
      if ((bVar1 == 0x5c) || (bVar1 == 0x22)) {
        local_38 = local_38 + 1;
      }
      else if (bVar1 < 0x20) {
        local_38 = local_38 + 5;
      }
      size_local = size_local + 1;
    }
    dst_local = local_38;
  }
  else {
    for (; sStack_28 != 0; sStack_28 = sStack_28 - 1) {
      bVar1 = *(byte *)size_local;
      if (bVar1 < 0x20) {
        *src_local = '\\';
        src_local[1] = 'u';
        src_local[2] = '0';
        src_local[3] = '0';
        puVar3 = src_local + 5;
        src_local[4] = (char)((int)(uint)bVar1 >> 4) + '0';
        bVar1 = bVar1 & 0xf;
        if (bVar1 < 10) {
          uVar2 = bVar1 + 0x30;
        }
        else {
          uVar2 = bVar1 + 0x37;
        }
        src_local = src_local + 6;
        *puVar3 = uVar2;
      }
      else {
        if ((bVar1 == 0x5c) || (bVar1 == 0x22)) {
          *src_local = '\\';
          src_local = src_local + 1;
        }
        *src_local = bVar1;
        src_local = src_local + 1;
      }
      size_local = size_local + 1;
    }
    dst_local = src_local;
  }
  return (uintptr_t)dst_local;
}

Assistant:

uintptr_t
ngx_escape_json(u_char *dst, u_char *src, size_t size)
{
    u_char      ch;
    ngx_uint_t  len;

    if (dst == NULL) {
        len = 0;

        while (size) {
            ch = *src++;

            if (ch == '\\' || ch == '"') {
                len++;

            } else if (ch <= 0x1f) {
                len += sizeof("\\u001F") - 2;
            }

            size--;
        }

        return (uintptr_t) len;
    }

    while (size) {
        ch = *src++;

        if (ch > 0x1f) {

            if (ch == '\\' || ch == '"') {
                *dst++ = '\\';
            }

            *dst++ = ch;

        } else {
            *dst++ = '\\'; *dst++ = 'u'; *dst++ = '0'; *dst++ = '0';
            *dst++ = '0' + (ch >> 4);

            ch &= 0xf;

            *dst++ = (ch < 10) ? ('0' + ch) : ('A' + ch - 10);
        }

        size--;
    }

    return (uintptr_t) dst;
}